

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall
wasm::ModuleStackIR::ModuleStackIR(ModuleStackIR *this,Module *wasm,PassOptions *options)

{
  anon_class_16_2_83d8e605 local_50;
  Func local_40;
  PassOptions *local_20;
  PassOptions *options_local;
  Module *wasm_local;
  ModuleStackIR *this_local;
  
  local_50.wasm = wasm;
  local_50.options = options;
  local_20 = options;
  options_local = (PassOptions *)wasm;
  wasm_local = (Module *)this;
  std::
  function<void(wasm::Function*,std::vector<wasm::StackInst*,std::allocator<wasm::StackInst*>>&)>::
  function<wasm::ModuleStackIR::ModuleStackIR(wasm::Module&,wasm::PassOptions_const&)::__0,void>
            ((function<void(wasm::Function*,std::vector<wasm::StackInst*,std::allocator<wasm::StackInst*>>&)>
              *)&local_40,&local_50);
  wasm::ModuleUtils::
  ParallelFunctionAnalysis<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  ::ParallelFunctionAnalysis(&this->analysis,wasm,&local_40);
  std::
  function<void_(wasm::Function_*,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_&)>
  ::~function((function<void_(wasm::Function_*,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_&)>
               *)&local_40);
  return;
}

Assistant:

ModuleStackIR::ModuleStackIR(Module& wasm, const PassOptions& options)
  : analysis(wasm, [&](Function* func, StackIR& stackIR) {
      if (func->imported()) {
        return;
      }

      StackIRGenerator stackIRGen(wasm, func);
      stackIRGen.write();
      stackIR = std::move(stackIRGen.getStackIR());

      if (options.optimizeStackIR) {
        StackIROptimizer optimizer(func, stackIR, options, wasm.features);
        optimizer.run();
      }
    }) {}